

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::Reshape::dim_forward
          (Dim *__return_storage_ptr__,Reshape *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs
          )

{
  Dim *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  
  this_00 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)this_00 != 0x24) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0xd6,"virtual Dim cnn::Reshape::dim_forward(const vector<Dim> &) const");
  }
  uVar4 = Dim::size(this_00);
  uVar5 = Dim::size(&this->to);
  if (uVar4 == uVar5) {
    __return_storage_ptr__->bd = (this->to).bd;
    uVar1 = *(undefined8 *)((this->to).d + 2);
    uVar2 = *(undefined8 *)((this->to).d + 4);
    uVar3 = *(undefined8 *)((this->to).d + 6);
    *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)(this->to).d;
    *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar1;
    *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar2;
    *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("xs[0].size() == to.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                ,0xd7,"virtual Dim cnn::Reshape::dim_forward(const vector<Dim> &) const");
}

Assistant:

Dim Reshape::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1);
  assert(xs[0].size() == to.size());
  return to;
}